

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

bool btGeneric6DofSpring2Constraint::matrixToEulerZXY(btMatrix3x3 *mat,btVector3 *xyz)

{
  btScalar *pbVar1;
  btVector3 *in_RSI;
  btScalar bVar2;
  btScalar fi;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  bVar2 = btGetMatrixElem((btMatrix3x3 *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
  if (1.0 <= bVar2) {
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar1 = 1.5707964;
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[1] = 0.0;
    bVar2 = btGetMatrixElem((btMatrix3x3 *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,bVar2),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.97686e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[2] = bVar2;
    local_1 = false;
  }
  else if (bVar2 <= -1.0) {
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar1 = -1.5707964;
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[1] = 0.0;
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.976672e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[2] = -bVar2;
    local_1 = false;
  }
  else {
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAsin(0.0);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar1 = bVar2;
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.976372e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[1] = bVar2;
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.976498e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[2] = bVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerZXY(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cz*cy-sz*sx*sy    -cx*sz   cz*sy+cy*sz*sx
	//        cy*sz+cz*sx*sy     cz*cx   sz*sy-cz*xy*sx
	//        -cx*sy              sx     cx*cy

	btScalar fi = btGetMatrixElem(mat,7);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAsin(btGetMatrixElem(mat,7));
			xyz[1] = btAtan2(-btGetMatrixElem(mat,6),btGetMatrixElem(mat,8));
			xyz[2] = btAtan2(-btGetMatrixElem(mat,1),btGetMatrixElem(mat,4));
			return true;
		}
		else
		{
			xyz[0] = -SIMD_HALF_PI;
			xyz[1] = btScalar(0.0);
			xyz[2] = -btAtan2(btGetMatrixElem(mat,2),btGetMatrixElem(mat,0));
			return false;
		}
	}
	else
	{
		xyz[0] = SIMD_HALF_PI;
		xyz[1] = btScalar(0.0);
		xyz[2] = btAtan2(btGetMatrixElem(mat,2),btGetMatrixElem(mat,0));
	}
	return false;
}